

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O0

void compute_stats_highbd_win5_opt_sse4_1
               (uint8_t *dgd8,uint8_t *src8,int h_start,int h_end,int v_start,int v_end,
               int dgd_stride,int src_stride,int64_t *M,int64_t *H,aom_bit_depth_t bit_depth)

{
  int iVar1;
  long lVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  long in_stack_00000018;
  long in_stack_00000020;
  int64_t *H_int_;
  int64_t *H_;
  int32_t idx0;
  int64_t avg_square_sum;
  uint8_t bit_depth_divider;
  int vert_end;
  __m128i shuffle;
  uint16_t *dgd_win;
  int32_t sumX;
  int32_t sumY [5] [5];
  int64_t H_int [25] [40];
  int64_t M_int [5] [5];
  uint16_t avg;
  uint16_t *dgd;
  uint16_t *src;
  int wiener_halfwin;
  int wiener_win2;
  int pixel_count;
  int wiener_win;
  int n;
  int m;
  int l;
  int k;
  int j;
  int i;
  int local_2134;
  byte local_210d;
  int local_20e8 [6];
  __m128i *in_stack_ffffffffffffdf30;
  int in_stack_ffffffffffffdf3c;
  int in_stack_ffffffffffffdf40;
  int in_stack_ffffffffffffdf44;
  uint16_t *in_stack_ffffffffffffdf48;
  uint16_t *in_stack_ffffffffffffdf50;
  long local_2078 [5];
  int32_t *in_stack_ffffffffffffdfb0;
  int32_t (*in_stack_ffffffffffffdfb8) [5];
  int64_t (*in_stack_ffffffffffffdfc0) [5];
  int64_t (*in_stack_ffffffffffffdfc8) [40];
  long local_138 [26];
  uint16_t local_62;
  uint16_t *local_60;
  long local_58;
  undefined4 local_50;
  undefined4 local_4c;
  int local_48;
  undefined4 local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  local_44 = 5;
  local_48 = (in_ECX - in_EDX) * (in_R9D - in_R8D);
  local_4c = 0x19;
  local_50 = 2;
  local_58 = in_RSI << 1;
  local_60 = (uint16_t *)(in_RDI << 1);
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_62 = find_average_highbd(local_60,in_EDX,in_ECX,in_R8D,in_R9D,in_stack_00000008);
  memset(local_138,0,200);
  memset(local_2078,0,8000);
  memset(local_20e8,0,100);
  xx_loadu_128("");
  for (local_30 = local_24; local_30 < local_28; local_30 = local_30 + 0x40) {
    if (local_28 - local_30 < 0x41) {
      local_2134 = local_28 - local_30;
    }
    else {
      local_2134 = 0x40;
    }
    local_2134 = local_2134 + local_30;
    for (local_2c = local_30; local_2c < local_2134; local_2c = local_2c + 1) {
      acc_stat_highbd_win5_one_line_sse4_1
                (in_stack_ffffffffffffdf50,in_stack_ffffffffffffdf48,in_stack_ffffffffffffdf44,
                 in_stack_ffffffffffffdf40,in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf30,
                 in_stack_ffffffffffffdfb0,in_stack_ffffffffffffdfb8,in_stack_ffffffffffffdfc0,
                 in_stack_ffffffffffffdfc8);
    }
  }
  local_210d = 1;
  if ((int)H_int_ == 0xc) {
    local_210d = 0x10;
  }
  else if ((int)H_int_ == 10) {
    local_210d = 4;
  }
  lVar2 = (ulong)local_62 * (ulong)local_62 * (long)local_48;
  for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
      iVar1 = local_38 * 5 + local_34;
      *(long *)(in_stack_00000018 + (long)iVar1 * 8) =
           (long)(local_138[(long)local_34 * 5 + (long)local_38] +
                 (lVar2 - (ulong)local_62 * (long)local_20e8[(long)local_34 * 5 + (long)local_38]))
           / (long)(ulong)local_210d;
      for (local_3c = 0; local_3c < 5; local_3c = local_3c + 1) {
        for (local_40 = 0; local_40 < 5; local_40 = local_40 + 1) {
          *(long *)(in_stack_00000020 + (long)(iVar1 * 0x19) * 8 +
                   (long)(local_3c * 5 + local_40) * 8) =
               (long)(local_2078[(long)iVar1 * 0x28 + (long)(local_40 * 8 + local_3c)] +
                     (lVar2 - (ulong)local_62 *
                              (long)(local_20e8[(long)local_34 * 5 + (long)local_38] +
                                    local_20e8[(long)local_40 * 5 + (long)local_3c]))) /
               (long)(ulong)local_210d;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void compute_stats_highbd_win5_opt_sse4_1(
    const uint8_t *dgd8, const uint8_t *src8, int h_start, int h_end,
    int v_start, int v_end, int dgd_stride, int src_stride, int64_t *M,
    int64_t *H, aom_bit_depth_t bit_depth) {
  int i, j, k, l, m, n;
  const int wiener_win = WIENER_WIN_CHROMA;
  const int pixel_count = (h_end - h_start) * (v_end - v_start);
  const int wiener_win2 = wiener_win * wiener_win;
  const int wiener_halfwin = (wiener_win >> 1);
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dgd = CONVERT_TO_SHORTPTR(dgd8);
  const uint16_t avg =
      find_average_highbd(dgd, h_start, h_end, v_start, v_end, dgd_stride);

  int64_t M_int[WIENER_WIN_CHROMA][WIENER_WIN_CHROMA] = { { 0 } };
  int64_t H_int[WIENER_WIN2_CHROMA][WIENER_WIN_CHROMA * 8] = { { 0 } };
  int32_t sumY[WIENER_WIN_CHROMA][WIENER_WIN_CHROMA] = { { 0 } };
  int32_t sumX = 0;
  const uint16_t *dgd_win = dgd - wiener_halfwin * dgd_stride - wiener_halfwin;

  // Load just half of the 256-bit shuffle control used for the AVX2 version
  const __m128i shuffle = xx_loadu_128(g_shuffle_stats_highbd_data);
  for (j = v_start; j < v_end; j += 64) {
    const int vert_end = AOMMIN(64, v_end - j) + j;
    for (i = j; i < vert_end; i++) {
      acc_stat_highbd_win5_one_line_sse4_1(
          dgd_win + i * dgd_stride, src + i * src_stride, h_start, h_end,
          dgd_stride, &shuffle, &sumX, sumY, M_int, H_int);
    }
  }

  uint8_t bit_depth_divider = 1;
  if (bit_depth == AOM_BITS_12)
    bit_depth_divider = 16;
  else if (bit_depth == AOM_BITS_10)
    bit_depth_divider = 4;

  const int64_t avg_square_sum = (int64_t)avg * (int64_t)avg * pixel_count;
  for (k = 0; k < wiener_win; k++) {
    for (l = 0; l < wiener_win; l++) {
      const int32_t idx0 = l * wiener_win + k;
      M[idx0] = (M_int[k][l] +
                 (avg_square_sum - (int64_t)avg * (sumX + sumY[k][l]))) /
                bit_depth_divider;
      int64_t *H_ = H + idx0 * wiener_win2;
      int64_t *H_int_ = &H_int[idx0][0];
      for (m = 0; m < wiener_win; m++) {
        for (n = 0; n < wiener_win; n++) {
          H_[m * wiener_win + n] =
              (H_int_[n * 8 + m] +
               (avg_square_sum - (int64_t)avg * (sumY[k][l] + sumY[n][m]))) /
              bit_depth_divider;
        }
      }
    }
  }
}